

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
llvm::SmallVectorImpl<std::__cxx11::string>::emplace_back<llvm::StringRef&>
          (SmallVectorImpl<std::__cxx11::string> *this,StringRef *Args)

{
  uint uVar1;
  
  uVar1 = *(uint *)(this + 8);
  if (*(uint *)(this + 0xc) <= uVar1) {
    SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ::grow((SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
            *)this,0);
    uVar1 = *(uint *)(this + 8);
  }
  StringRef::str_abi_cxx11_((string *)((ulong)uVar1 * 0x20 + *(long *)this),Args);
  SmallVectorBase::set_size((SmallVectorBase *)this,(ulong)*(uint *)(this + 8) + 1);
  return;
}

Assistant:

void emplace_back(ArgTypes &&... Args) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    ::new ((void *)this->end()) T(std::forward<ArgTypes>(Args)...);
    this->set_size(this->size() + 1);
  }